

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINSetNoInitSetup(void *kinmem,int noInitSetup)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetNoInitSetup","kinsol_mem = NULL illegal.");
  }
  else {
    *(int *)((long)kinmem + 0xb8) = noInitSetup;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINSetNoInitSetup(void *kinmem, booleantype noInitSetup)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetNoInitSetup", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;
  kin_mem->kin_noInitSetup = noInitSetup;

  return(KIN_SUCCESS);
}